

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

bool_t ecIsOperable2(ec_o *ec)

{
  bool_t bVar1;
  ulong *in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  bool bVar2;
  
  bVar1 = objIsOperable2((void *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  bVar2 = false;
  if ((((bVar1 != 0) && (bVar2 = false, 0xaf < *in_RDI)) && (bVar2 = false, in_RDI[1] == 6)) &&
     (bVar2 = false, in_RDI[2] == 1)) {
    bVar1 = memIsValid((void *)in_RDI[4],*(long *)(in_RDI[3] + 0x30) << 3);
    bVar2 = false;
    if (bVar1 != 0) {
      bVar1 = memIsValid((void *)in_RDI[5],*(long *)(in_RDI[3] + 0x30) << 3);
      bVar2 = false;
      if ((((bVar1 != 0) && (bVar2 = false, 2 < in_RDI[9])) &&
          ((bVar2 = false, in_RDI[0xb] != 0 &&
           ((bVar2 = false, in_RDI[0xc] != 0 && (bVar2 = false, in_RDI[0xd] != 0)))))) &&
         ((bVar2 = false, in_RDI[0xe] != 0 &&
          ((((bVar2 = false, in_RDI[0xf] != 0 && (bVar2 = false, in_RDI[0x10] != 0)) &&
            (bVar2 = false, in_RDI[0x11] != 0)) && (bVar2 = false, in_RDI[0x12] != 0)))))) {
        bVar2 = in_RDI[0x13] != 0;
      }
    }
  }
  return (bool_t)bVar2;
}

Assistant:

bool_t ecIsOperable2(const ec_o* ec)
{
	return objIsOperable2(ec) &&
		objKeep(ec) >= sizeof(ec_o) &&
		objPCount(ec) == 6 &&
		objOCount(ec) == 1 &&
		wwIsValid(ec->A, ec->f->n) &&
		wwIsValid(ec->B, ec->f->n) &&
		ec->d >= 3 &&
		ec->froma != 0 &&	
		ec->toa != 0 &&	
		ec->neg != 0 &&	
		ec->add != 0 &&	
		ec->adda != 0 &&	
		ec->sub != 0 &&	
		ec->suba != 0 &&	
		ec->dbl != 0 &&	
		ec->dbla != 0;
}